

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

void __thiscall
PDA::Transducer::Grammar::Rule::addChains<wchar_t[4],wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
          (Rule *this,wchar_t (*first) [4],wchar_t (*rest) [4],wchar_t (*rest_1) [5],
          wchar_t (*rest_2) [7],wchar_t (*rest_3) [7])

{
  allocator<wchar_t> local_71;
  Chain local_70;
  wstring local_50 [32];
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_50,*first,&local_71);
  std::__cxx11::wstring::wstring((wstring *)&local_70,local_50);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  emplace_back<PDA::Transducer::Grammar::Chain>(&this->m_chains,&local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  std::__cxx11::wstring::~wstring(local_50);
  addChains<wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>(this,rest,rest_1,rest_2,rest_3);
  return;
}

Assistant:

void addChains(const First &first, const Rest&... rest)
        {
            m_chains.push_back(Chain(first));
            addChains(rest...);
        }